

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall LLVMBC::BasicBlock::add_successor(BasicBlock *this,BasicBlock *succ)

{
  bool bVar1;
  __normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  local_38;
  BasicBlock **local_30;
  __normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  local_28;
  __normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  local_20;
  BasicBlock *local_18;
  BasicBlock *succ_local;
  BasicBlock *this_local;
  
  local_18 = succ;
  succ_local = this;
  local_28._M_current =
       (BasicBlock **)
       std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
       begin(&this->succs);
  local_30 = (BasicBlock **)
             std::
             vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
             end(&this->succs);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<LLVMBC::BasicBlock**,std::vector<LLVMBC::BasicBlock*,dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock*>>>,LLVMBC::BasicBlock*>
                       (local_28,(__normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
                                  )local_30,&local_18);
  local_38._M_current =
       (BasicBlock **)
       std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::end
                 (&this->succs);
  bVar1 = __gnu_cxx::operator==(&local_20,&local_38);
  if (bVar1) {
    std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
    push_back(&this->succs,&local_18);
  }
  return;
}

Assistant:

void BasicBlock::add_successor(BasicBlock *succ)
{
	if (std::find(succs.begin(), succs.end(), succ) == succs.end())
		succs.push_back(succ);
}